

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O3

size_t duckdb_zstd::HUF_decompress4X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  ulong *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  long lVar10;
  char cVar11;
  ulong *puVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  uint uVar17;
  undefined1 *puVar18;
  int iVar19;
  int iVar20;
  byte *srcBuffer;
  int iVar21;
  ulong *puVar22;
  int iVar23;
  ulong uVar24;
  undefined1 *puVar25;
  int iVar26;
  undefined4 in_register_0000008c;
  ulong uVar27;
  ulong uVar28;
  undefined1 *puVar29;
  ulong uVar30;
  ulong *puVar31;
  ulong *puVar32;
  bool bVar33;
  uint uStack_12c;
  uint uStack_128;
  ulong uStack_120;
  ulong *puStack_118;
  ulong uStack_110;
  uint uStack_104;
  ulong *puStack_f8;
  ulong *puStack_e8;
  ulong *puStack_d8;
  undefined1 *puStack_d0;
  BIT_DStream_t BStack_c8;
  ulong uStack_a0;
  undefined1 *puStack_98;
  ulong *puStack_90;
  ulong *puStack_88;
  BitContainerType BStack_80;
  undefined1 *puStack_78;
  ulong uStack_70;
  size_t sStack_50;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar13 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar13;
  }
  if ((flags & 1U) != 0) {
    if (((flags & 0x20U) == 0) &&
       (sVar13 = HUF_decompress4X1_usingDTable_internal_fast
                           (dst,maxDstSize,cSrc,cSrcSize,DTable,
                            (HUF_DecompressFastLoopFn)CONCAT44(in_register_0000008c,flags)),
       sVar13 != 0)) {
      return sVar13;
    }
    sVar13 = HUF_decompress4X1_usingDTable_internal_bmi2(dst,maxDstSize,cSrc,cSrcSize,DTable);
    return sVar13;
  }
  if (maxDstSize < 6 || cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar7 = *cSrc;
  uVar24 = (ulong)uVar7;
  uVar8 = *(ushort *)((long)cSrc + 2);
  uVar9 = *(ushort *)((long)cSrc + 4);
  uVar14 = uVar24 + uVar8 + (ulong)uVar9 + 6;
  if (cSrcSize < uVar14) {
    return 0xffffffffffffffec;
  }
  puStack_78 = (undefined1 *)(maxDstSize + (long)dst);
  uVar15 = maxDstSize + 3 >> 2;
  puStack_98 = (undefined1 *)(uVar15 + (long)dst);
  puVar2 = puStack_98 + uVar15;
  puVar3 = puVar2 + uVar15;
  if (puStack_78 < puVar3) {
    return 0xffffffffffffffec;
  }
  if (uVar7 == 0) {
    return 0xffffffffffffffb8;
  }
  puStack_88 = (ulong *)((long)cSrc + 6);
  puStack_90 = (ulong *)((long)cSrc + uVar24 + 6);
  uStack_70 = (ulong)*(ushort *)((long)DTable + 2);
  if (uVar7 < 8) {
    uStack_110 = (ulong)*(byte *)puStack_88;
    switch(uVar7) {
    case 2:
      goto LAB_01d7d786;
    case 3:
      goto LAB_01d7d77b;
    case 4:
      break;
    case 7:
      uStack_110 = uStack_110 | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30;
    case 6:
      uStack_110 = uStack_110 + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
    case 5:
      uStack_110 = uStack_110 + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
      break;
    default:
      goto switchD_01d7d729_default;
    }
    uStack_110 = uStack_110 + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
LAB_01d7d77b:
    uStack_110 = uStack_110 + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
LAB_01d7d786:
    uStack_110 = uStack_110 + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
switchD_01d7d729_default:
    bVar16 = *(byte *)((long)cSrc + uVar24 + 5);
    if (bVar16 == 0) {
      return 0xffffffffffffffec;
    }
    uVar17 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    uStack_104 = (uVar17 ^ 0x1f) + (uint)uVar7 * -8 + 0x29;
    puStack_d8 = puStack_88;
  }
  else {
    bVar16 = *(byte *)((long)cSrc + uVar24 + 5);
    if (bVar16 == 0) {
      return 0xffffffffffffffff;
    }
    uStack_110 = *(ulong *)((long)cSrc + (uVar24 - 2));
    uVar17 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    uStack_104 = ~uVar17 + 9;
    puStack_d8 = (ulong *)((long)cSrc + (uVar24 - 2));
  }
  if (uVar8 == 0) {
    return 0xffffffffffffffb8;
  }
  puVar22 = (ulong *)((ulong)uVar8 + (long)puStack_90);
  if (uVar8 < 8) {
    uStack_120 = (ulong)(byte)*puStack_90;
    switch(uVar8) {
    case 2:
      goto LAB_01d7d8c2;
    case 3:
      goto LAB_01d7d8b7;
    case 4:
      goto LAB_01d7d8ac;
    case 5:
      goto LAB_01d7d8a0;
    case 6:
      break;
    case 7:
      uStack_120 = uStack_120 | (ulong)*(byte *)((long)cSrc + uVar24 + 0xc) << 0x30;
      break;
    default:
      goto switchD_01d7d845_default;
    }
    uStack_120 = uStack_120 + ((ulong)*(byte *)((long)cSrc + uVar24 + 0xb) << 0x28);
LAB_01d7d8a0:
    uStack_120 = uStack_120 + ((ulong)*(byte *)((long)cSrc + uVar24 + 10) << 0x20);
LAB_01d7d8ac:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)cSrc + uVar24 + 9) * 0x1000000;
LAB_01d7d8b7:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)cSrc + uVar24 + 8) * 0x10000;
LAB_01d7d8c2:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)cSrc + uVar24 + 7) * 0x100;
switchD_01d7d845_default:
    bVar16 = *(byte *)((long)puVar22 + -1);
    if (bVar16 == 0) {
      return 0xffffffffffffffec;
    }
    uVar17 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    uStack_12c = (uVar17 ^ 0x1f) + (uint)uVar8 * -8 + 0x29;
    puStack_e8 = puStack_90;
  }
  else {
    bVar16 = *(byte *)((long)puVar22 + -1);
    if (bVar16 == 0) {
      return 0xffffffffffffffff;
    }
    uStack_120 = puVar22[-1];
    uVar17 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    uStack_12c = ~uVar17 + 9;
    puStack_e8 = puVar22 + -1;
  }
  if (uVar9 == 0) {
    return 0xffffffffffffffb8;
  }
  srcBuffer = (byte *)((ulong)uVar9 + (long)puVar22);
  if (uVar9 < 8) {
    uStack_a0 = (ulong)(byte)*puVar22;
    switch(uVar9) {
    case 7:
      uStack_a0 = uStack_a0 | (ulong)*(byte *)((long)puVar22 + 6) << 0x30;
    case 6:
      uStack_a0 = uStack_a0 + ((ulong)*(byte *)((long)puVar22 + 5) << 0x28);
    case 5:
      uStack_a0 = uStack_a0 + ((ulong)*(byte *)((long)puVar22 + 4) << 0x20);
    case 4:
      uStack_a0 = uStack_a0 + (ulong)*(byte *)((long)puVar22 + 3) * 0x1000000;
    case 3:
      uStack_a0 = uStack_a0 + (ulong)*(byte *)((long)puVar22 + 2) * 0x10000;
    case 2:
      uStack_a0 = uStack_a0 + (ulong)*(byte *)((long)puVar22 + 1) * 0x100;
    }
    bVar16 = srcBuffer[-1];
    if (bVar16 == 0) {
      return 0xffffffffffffffec;
    }
    uVar17 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    uStack_128 = (uVar17 ^ 0x1f) + (uint)uVar9 * -8 + 0x29;
    puStack_f8 = puVar22;
  }
  else {
    bVar16 = srcBuffer[-1];
    if (bVar16 == 0) {
      return 0xffffffffffffffff;
    }
    uStack_a0 = *(ulong *)(srcBuffer + -8);
    uVar17 = 0x1f;
    if (bVar16 != 0) {
      for (; bVar16 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    uStack_128 = ~uVar17 + 9;
    puStack_f8 = (ulong *)(srcBuffer + -8);
  }
  sStack_50 = maxDstSize;
  sVar13 = BIT_initDStream(&BStack_c8,srcBuffer,cSrcSize - uVar14);
  if (0xffffffffffffff88 < sVar13) {
    return sVar13;
  }
  puVar18 = (undefined1 *)((long)dst + (sStack_50 - 3));
  puVar31 = (ulong *)((long)cSrc + 0xe);
  puVar32 = puStack_90 + 1;
  puVar1 = puVar22 + 1;
  cVar11 = (char)uStack_70;
  puVar25 = puVar2;
  puVar29 = puStack_98;
  puStack_d0 = puVar3;
  if (puVar3 < puVar18 && 7 < (ulong)((long)puStack_78 - (long)puVar3)) {
    BStack_80 = BStack_c8.bitContainer;
    bVar16 = -cVar11 & 0x3f;
    lVar10 = uVar15 * 3;
    do {
      puVar25 = (undefined1 *)dst;
      uVar14 = (uStack_110 << ((byte)uStack_104 & 0x3f)) >> bVar16;
      uVar24 = (uStack_120 << ((byte)uStack_12c & 0x3f)) >> bVar16;
      uVar27 = (uStack_a0 << ((byte)uStack_128 & 0x3f)) >> bVar16;
      iVar19 = *(byte *)((long)DTable + uVar14 * 2 + 4) + uStack_104;
      uVar28 = (BStack_80 << ((byte)BStack_c8.bitsConsumed & 0x3f)) >> bVar16;
      uVar30 = (uStack_110 << ((byte)iVar19 & 0x3f)) >> bVar16;
      *puVar25 = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
      iVar21 = *(byte *)((long)DTable + uVar24 * 2 + 4) + uStack_12c;
      puVar25[uVar15] = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
      iVar23 = *(byte *)((long)DTable + uVar27 * 2 + 4) + uStack_128;
      puVar25[uVar15 * 2] = *(undefined1 *)((long)DTable + uVar27 * 2 + 5);
      iVar26 = *(byte *)((long)DTable + uVar28 * 2 + 4) + BStack_c8.bitsConsumed;
      puVar25[lVar10] = *(undefined1 *)((long)DTable + uVar28 * 2 + 5);
      uVar14 = (uStack_120 << ((byte)iVar21 & 0x3f)) >> bVar16;
      uVar27 = (uStack_a0 << ((byte)iVar23 & 0x3f)) >> bVar16;
      iVar19 = (uint)*(byte *)((long)DTable + uVar30 * 2 + 4) + iVar19;
      uVar28 = (BStack_80 << ((byte)iVar26 & 0x3f)) >> bVar16;
      uVar24 = (uStack_110 << ((byte)iVar19 & 0x3f)) >> bVar16;
      puVar25[1] = *(undefined1 *)((long)DTable + uVar30 * 2 + 5);
      iVar21 = (uint)*(byte *)((long)DTable + uVar14 * 2 + 4) + iVar21;
      puVar25[uVar15 + 1] = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
      iVar23 = (uint)*(byte *)((long)DTable + uVar27 * 2 + 4) + iVar23;
      puVar25[uVar15 * 2 + 1] = *(undefined1 *)((long)DTable + uVar27 * 2 + 5);
      iVar26 = (uint)*(byte *)((long)DTable + uVar28 * 2 + 4) + iVar26;
      puVar25[lVar10 + 1] = *(undefined1 *)((long)DTable + uVar28 * 2 + 5);
      iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 4) + iVar19;
      puVar25[2] = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
      uVar14 = (uStack_120 << ((byte)iVar21 & 0x3f)) >> bVar16;
      uVar24 = (uStack_a0 << ((byte)iVar23 & 0x3f)) >> bVar16;
      iVar21 = (uint)*(byte *)((long)DTable + uVar14 * 2 + 4) + iVar21;
      uVar27 = (BStack_80 << ((byte)iVar26 & 0x3f)) >> bVar16;
      uVar28 = (uStack_110 << ((byte)iVar19 & 0x3f)) >> bVar16;
      puVar25[uVar15 + 2] = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
      iVar23 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 4) + iVar23;
      puVar25[uVar15 * 2 + 2] = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
      iVar26 = (uint)*(byte *)((long)DTable + uVar27 * 2 + 4) + iVar26;
      puVar25[lVar10 + 2] = *(undefined1 *)((long)DTable + uVar27 * 2 + 5);
      uStack_104 = (uint)*(byte *)((long)DTable + uVar28 * 2 + 4) + iVar19;
      puVar25[3] = *(undefined1 *)((long)DTable + uVar28 * 2 + 5);
      uVar14 = (uStack_120 << ((byte)iVar21 & 0x3f)) >> bVar16;
      bVar4 = *(byte *)((long)DTable + uVar14 * 2 + 4);
      puVar25[uVar15 + 3] = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
      uVar14 = (uStack_a0 << ((byte)iVar23 & 0x3f)) >> bVar16;
      bVar5 = *(byte *)((long)DTable + uVar14 * 2 + 4);
      puVar25[uVar15 * 2 + 3] = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
      uVar14 = (BStack_80 << ((byte)iVar26 & 0x3f)) >> bVar16;
      bVar6 = *(byte *)((long)DTable + uVar14 * 2 + 4);
      puVar25[lVar10 + 3] = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
      iVar19 = 3;
      if (puStack_d8 < puVar31) {
        iVar20 = 3;
      }
      else {
        puStack_d8 = (ulong *)((long)puStack_d8 - (ulong)(uStack_104 >> 3));
        uStack_104 = uStack_104 & 7;
        uStack_110 = *puStack_d8;
        iVar20 = 0;
      }
      uStack_12c = iVar21 + (uint)bVar4;
      if (puVar32 <= puStack_e8) {
        puStack_e8 = (ulong *)((long)puStack_e8 - (ulong)(uStack_12c >> 3));
        uStack_12c = uStack_12c & 7;
        uStack_120 = *puStack_e8;
        iVar19 = 0;
      }
      uStack_128 = iVar23 + (uint)bVar5;
      iVar23 = 3;
      if (puStack_f8 < puVar1) {
        iVar21 = 3;
      }
      else {
        puStack_f8 = (ulong *)((long)puStack_f8 - (ulong)(uStack_128 >> 3));
        uStack_128 = uStack_128 & 7;
        uStack_a0 = *puStack_f8;
        iVar21 = 0;
      }
      BStack_c8.bitsConsumed = iVar26 + (uint)bVar6;
      if (BStack_c8.limitPtr <= BStack_c8.ptr) {
        BStack_c8.ptr = (char *)((long)BStack_c8.ptr - (ulong)(BStack_c8.bitsConsumed >> 3));
        BStack_c8.bitsConsumed = BStack_c8.bitsConsumed & 7;
        BStack_c8.bitContainer = *(BitContainerType *)BStack_c8.ptr;
        iVar23 = 0;
        BStack_80 = BStack_c8.bitContainer;
      }
    } while ((puVar25 + lVar10 + 4 < puVar18) &&
            (dst = puVar25 + 4, ((iVar19 == 0 && iVar20 == 0) && iVar21 == 0) && iVar23 == 0));
    dst = puVar25 + 4;
    puVar25 = (undefined1 *)((long)dst + uVar15 * 2);
    puVar29 = (undefined1 *)((long)dst + uVar15);
    puStack_d0 = (undefined1 *)((long)dst + lVar10);
  }
  if ((puStack_98 < dst) || (puVar2 < puVar29)) {
    return 0xffffffffffffffec;
  }
  if (puVar3 < puVar25) {
    return 0xffffffffffffffec;
  }
  if ((long)puStack_98 - (long)dst < 4) {
    if (uStack_104 < 0x41) {
      if (puStack_d8 < puVar31) {
        if (puStack_d8 == puStack_88) {
          puStack_118 = puStack_88;
          puVar12 = puStack_118;
          goto LAB_01d7e0d6;
        }
        uVar17 = (int)puStack_d8 - (int)puStack_88;
        if (puStack_88 <= (ulong *)((long)puStack_d8 - (ulong)(uStack_104 >> 3))) {
          uVar17 = uStack_104 >> 3;
        }
        uStack_104 = uStack_104 + uVar17 * -8;
      }
      else {
        uVar17 = uStack_104 >> 3;
        uStack_104 = uStack_104 & 7;
      }
      uStack_110 = *(ulong *)((long)puStack_d8 - (ulong)uVar17);
      puVar12 = (ulong *)((long)puStack_d8 - (ulong)uVar17);
    }
    else {
      puStack_118 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
      puVar12 = puStack_118;
    }
  }
  else {
    puStack_118 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
    puVar12 = puStack_118;
    if (uStack_104 < 0x41) {
      bVar16 = -cVar11 & 0x3f;
      do {
        if (puStack_d8 < puVar31) {
          if (puStack_d8 == puStack_88) {
            puStack_118 = puStack_88;
            puVar12 = puStack_118;
            break;
          }
          bVar33 = puStack_88 <= (ulong *)((long)puStack_d8 - (ulong)(uStack_104 >> 3));
          uVar17 = (int)puStack_d8 - (int)puStack_88;
          if (bVar33) {
            uVar17 = uStack_104 >> 3;
          }
          uStack_104 = uStack_104 + uVar17 * -8;
        }
        else {
          uVar17 = uStack_104 >> 3;
          uStack_104 = uStack_104 & 7;
          bVar33 = true;
        }
        puStack_d8 = (ulong *)((long)puStack_d8 - (ulong)uVar17);
        uStack_110 = *puStack_d8;
        puVar12 = puStack_d8;
        if ((puStack_98 + -3 <= dst) || (!bVar33)) break;
        uVar14 = (uStack_110 << ((byte)uStack_104 & 0x3f)) >> bVar16;
        iVar19 = *(byte *)((long)DTable + uVar14 * 2 + 4) + uStack_104;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
        uVar24 = (uStack_110 << ((byte)iVar19 & 0x3f)) >> bVar16;
        iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 4) + iVar19;
        uVar14 = (uStack_110 << ((byte)iVar19 & 0x3f)) >> bVar16;
        *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
        iVar19 = (uint)*(byte *)((long)DTable + uVar14 * 2 + 4) + iVar19;
        uVar24 = (uStack_110 << ((byte)iVar19 & 0x3f)) >> bVar16;
        *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
        uStack_104 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 4) + iVar19;
        *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
        dst = (void *)((long)dst + 4);
        puVar12 = puStack_118;
        if (0x40 < uStack_104) break;
      } while( true );
    }
  }
LAB_01d7e0d6:
  puStack_118 = puVar12;
  if (dst < puStack_98) {
    do {
      uVar14 = (uStack_110 << ((byte)uStack_104 & 0x3f)) >> (-cVar11 & 0x3fU);
      uStack_104 = uStack_104 + *(byte *)((long)DTable + uVar14 * 2 + 4);
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
      dst = (void *)((long)dst + 1);
    } while (dst < puStack_98);
  }
  if ((long)puVar2 - (long)puVar29 < 4) {
    if (uStack_12c < 0x41) {
      if (puStack_e8 < puVar32) {
        puVar31 = puStack_90;
        if (puStack_e8 == puStack_90) goto LAB_01d7e302;
        uVar17 = (int)puStack_e8 - (int)puStack_90;
        if (puStack_90 <= (ulong *)((long)puStack_e8 - (ulong)(uStack_12c >> 3))) {
          uVar17 = uStack_12c >> 3;
        }
        uStack_12c = uStack_12c + uVar17 * -8;
      }
      else {
        uVar17 = uStack_12c >> 3;
        uStack_12c = uStack_12c & 7;
      }
      uStack_120 = *(ulong *)((long)puStack_e8 - (ulong)uVar17);
      puVar31 = (ulong *)((long)puStack_e8 - (ulong)uVar17);
    }
    else {
      puVar31 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
    }
  }
  else {
    puVar31 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
    if (uStack_12c < 0x41) {
      bVar16 = -cVar11 & 0x3f;
      do {
        if (puStack_e8 < puVar32) {
          puVar31 = puStack_90;
          if (puStack_e8 == puStack_90) break;
          bVar33 = puStack_90 <= (ulong *)((long)puStack_e8 - (ulong)(uStack_12c >> 3));
          uVar17 = (int)puStack_e8 - (int)puStack_90;
          if (bVar33) {
            uVar17 = uStack_12c >> 3;
          }
          uStack_12c = uStack_12c + uVar17 * -8;
        }
        else {
          uVar17 = uStack_12c >> 3;
          uStack_12c = uStack_12c & 7;
          bVar33 = true;
        }
        puStack_e8 = (ulong *)((long)puStack_e8 - (ulong)uVar17);
        uStack_120 = *puStack_e8;
        puVar31 = puStack_e8;
        if ((puVar2 + -3 <= puVar29) || (!bVar33)) break;
        uVar14 = (uStack_120 << ((byte)uStack_12c & 0x3f)) >> bVar16;
        iVar19 = *(byte *)((long)DTable + uVar14 * 2 + 4) + uStack_12c;
        *puVar29 = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
        uVar14 = (uStack_120 << ((byte)iVar19 & 0x3f)) >> bVar16;
        iVar19 = (uint)*(byte *)((long)DTable + uVar14 * 2 + 4) + iVar19;
        uVar24 = (uStack_120 << ((byte)iVar19 & 0x3f)) >> bVar16;
        puVar29[1] = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
        iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 4) + iVar19;
        uVar14 = (uStack_120 << ((byte)iVar19 & 0x3f)) >> bVar16;
        puVar29[2] = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
        uStack_12c = (uint)*(byte *)((long)DTable + uVar14 * 2 + 4) + iVar19;
        puVar29[3] = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
        puVar29 = puVar29 + 4;
        puVar31 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
        if (0x40 < uStack_12c) break;
      } while( true );
    }
  }
LAB_01d7e302:
  if (puVar29 < puVar2) {
    do {
      uVar14 = (uStack_120 << ((byte)uStack_12c & 0x3f)) >> (-cVar11 & 0x3fU);
      uStack_12c = uStack_12c + *(byte *)((long)DTable + uVar14 * 2 + 4);
      *puVar29 = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
      puVar29 = puVar29 + 1;
    } while (puVar29 < puVar2);
  }
  if ((long)puVar3 - (long)puVar25 < 4) {
    if (0x40 < uStack_128) goto LAB_01d7e478;
    if (puStack_f8 < puVar1) {
      puVar32 = puVar22;
      if (puStack_f8 != puVar22) {
        uVar17 = (int)puStack_f8 - (int)puVar22;
        if (puVar22 <= (ulong *)((long)puStack_f8 - (ulong)(uStack_128 >> 3))) {
          uVar17 = uStack_128 >> 3;
        }
        uStack_128 = uStack_128 + uVar17 * -8;
        goto LAB_01d7e4e5;
      }
    }
    else {
      uVar17 = uStack_128 >> 3;
      uStack_128 = uStack_128 & 7;
LAB_01d7e4e5:
      uStack_a0 = *(ulong *)((long)puStack_f8 - (ulong)uVar17);
      puVar32 = (ulong *)((long)puStack_f8 - (ulong)uVar17);
    }
  }
  else {
    if (uStack_128 < 0x41) {
      bVar16 = -cVar11 & 0x3f;
      do {
        if (puStack_f8 < puVar1) {
          puVar32 = puVar22;
          if (puStack_f8 == puVar22) goto LAB_01d7e4fb;
          bVar33 = puVar22 <= (ulong *)((long)puStack_f8 - (ulong)(uStack_128 >> 3));
          uVar17 = (int)puStack_f8 - (int)puVar22;
          if (bVar33) {
            uVar17 = uStack_128 >> 3;
          }
          uStack_128 = uStack_128 + uVar17 * -8;
        }
        else {
          uVar17 = uStack_128 >> 3;
          uStack_128 = uStack_128 & 7;
          bVar33 = true;
        }
        puStack_f8 = (ulong *)((long)puStack_f8 - (ulong)uVar17);
        uStack_a0 = *puStack_f8;
        puVar32 = puStack_f8;
        if ((puVar3 + -3 <= puVar25) || (!bVar33)) goto LAB_01d7e4fb;
        uVar14 = (uStack_a0 << ((byte)uStack_128 & 0x3f)) >> bVar16;
        iVar19 = *(byte *)((long)DTable + uVar14 * 2 + 4) + uStack_128;
        *puVar25 = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
        uVar14 = (uStack_a0 << ((byte)iVar19 & 0x3f)) >> bVar16;
        iVar19 = (uint)*(byte *)((long)DTable + uVar14 * 2 + 4) + iVar19;
        uVar24 = (uStack_a0 << ((byte)iVar19 & 0x3f)) >> bVar16;
        puVar25[1] = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
        iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 4) + iVar19;
        uVar14 = (uStack_a0 << ((byte)iVar19 & 0x3f)) >> bVar16;
        puVar25[2] = *(undefined1 *)((long)DTable + uVar24 * 2 + 5);
        uStack_128 = (uint)*(byte *)((long)DTable + uVar14 * 2 + 4) + iVar19;
        puVar25[3] = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
        puVar25 = puVar25 + 4;
      } while (uStack_128 < 0x41);
    }
LAB_01d7e478:
    puVar32 = &BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
  }
LAB_01d7e4fb:
  if (puVar25 < puVar3) {
    do {
      uVar14 = (uStack_a0 << ((byte)uStack_128 & 0x3f)) >> (-cVar11 & 0x3fU);
      uStack_128 = uStack_128 + *(byte *)((long)DTable + uVar14 * 2 + 4);
      *puVar25 = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
      puVar25 = puVar25 + 1;
    } while (puVar25 < puVar3);
  }
  if ((long)puStack_78 - (long)puStack_d0 < 4) {
    if (BStack_c8.bitsConsumed < 0x41) {
      if (BStack_c8.ptr < BStack_c8.limitPtr) {
        if (BStack_c8.ptr == BStack_c8.start) goto LAB_01d7e73c;
        uVar17 = (int)BStack_c8.ptr - (int)BStack_c8.start;
        if (BStack_c8.start <=
            (BitContainerType *)((long)BStack_c8.ptr - (ulong)(BStack_c8.bitsConsumed >> 3))) {
          uVar17 = BStack_c8.bitsConsumed >> 3;
        }
        BStack_c8.bitsConsumed = BStack_c8.bitsConsumed + uVar17 * -8;
      }
      else {
        uVar17 = BStack_c8.bitsConsumed >> 3;
        BStack_c8.bitsConsumed = BStack_c8.bitsConsumed & 7;
      }
      BStack_c8.ptr = (char *)((long)BStack_c8.ptr - (ulong)uVar17);
      BStack_c8.bitContainer = *(BitContainerType *)BStack_c8.ptr;
    }
    else {
      BStack_c8.ptr = "";
    }
  }
  else {
    if (BStack_c8.bitsConsumed < 0x41) {
      bVar16 = -cVar11 & 0x3f;
      do {
        if (BStack_c8.ptr < BStack_c8.limitPtr) {
          if (BStack_c8.ptr == BStack_c8.start) goto LAB_01d7e73c;
          bVar33 = BStack_c8.start <=
                   (BitContainerType *)((long)BStack_c8.ptr - (ulong)(BStack_c8.bitsConsumed >> 3));
          uVar14 = (ulong)(uint)((int)BStack_c8.ptr - (int)BStack_c8.start);
          if (bVar33) {
            uVar14 = (ulong)(BStack_c8.bitsConsumed >> 3);
          }
          BStack_c8.bitsConsumed = BStack_c8.bitsConsumed + (int)uVar14 * -8;
        }
        else {
          uVar14 = (ulong)(BStack_c8.bitsConsumed >> 3);
          BStack_c8.bitsConsumed = BStack_c8.bitsConsumed & 7;
          bVar33 = true;
        }
        BStack_c8.ptr = (char *)((long)BStack_c8.ptr - uVar14);
        BStack_c8.bitContainer = *(BitContainerType *)BStack_c8.ptr;
        if ((puVar18 <= puStack_d0) || (!bVar33)) goto LAB_01d7e73c;
        uVar14 = (BStack_c8.bitContainer << ((byte)BStack_c8.bitsConsumed & 0x3f)) >> bVar16;
        iVar19 = *(byte *)((long)DTable + uVar14 * 2 + 4) + BStack_c8.bitsConsumed;
        *puStack_d0 = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
        uVar14 = (BStack_c8.bitContainer << ((byte)iVar19 & 0x3f)) >> bVar16;
        iVar19 = (uint)*(byte *)((long)DTable + uVar14 * 2 + 4) + iVar19;
        puStack_d0[1] = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
        uVar14 = (BStack_c8.bitContainer << ((byte)iVar19 & 0x3f)) >> bVar16;
        iVar19 = (uint)*(byte *)((long)DTable + uVar14 * 2 + 4) + iVar19;
        puStack_d0[2] = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
        uVar14 = (BStack_c8.bitContainer << ((byte)iVar19 & 0x3f)) >> bVar16;
        BStack_c8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar14 * 2 + 4) + iVar19;
        puStack_d0[3] = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
        puStack_d0 = puStack_d0 + 4;
      } while (BStack_c8.bitsConsumed < 0x41);
    }
    BStack_c8.ptr = "";
  }
LAB_01d7e73c:
  if (puStack_d0 < puStack_78) {
    do {
      uVar14 = (BStack_c8.bitContainer << ((byte)BStack_c8.bitsConsumed & 0x3f)) >>
               (-cVar11 & 0x3fU);
      BStack_c8.bitsConsumed = *(byte *)((long)DTable + uVar14 * 2 + 4) + BStack_c8.bitsConsumed;
      *puStack_d0 = *(undefined1 *)((long)DTable + uVar14 * 2 + 5);
      puStack_d0 = puStack_d0 + 1;
    } while (puStack_d0 < puStack_78);
  }
  if (BStack_c8.bitsConsumed != 0x40) {
    sStack_50 = 0xffffffffffffffec;
  }
  if (BStack_c8.ptr != BStack_c8.start) {
    sStack_50 = 0xffffffffffffffec;
  }
  if (uStack_128 != 0x40) {
    sStack_50 = 0xffffffffffffffec;
  }
  if (puVar32 != puVar22) {
    sStack_50 = 0xffffffffffffffec;
  }
  if (uStack_12c != 0x40) {
    sStack_50 = 0xffffffffffffffec;
  }
  if (puVar31 != puStack_90) {
    sStack_50 = 0xffffffffffffffec;
  }
  if (uStack_104 != 0x40) {
    sStack_50 = 0xffffffffffffffec;
  }
  if (puStack_118 != puStack_88) {
    sStack_50 = 0xffffffffffffffec;
  }
  return sStack_50;
}

Assistant:

size_t HUF_decompress4X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}